

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::ServiceOptions::MergePartialFromCodedStream
          (ServiceOptions *this,CodedInputStream *input)

{
  InternalMetadataWithArena *this_00;
  byte *pbVar1;
  byte bVar2;
  uint8 uVar3;
  byte *pbVar4;
  uint8 *puVar5;
  void *pvVar6;
  bool bVar7;
  uint uVar8;
  uint32 uVar9;
  Type *this_01;
  pair<int,_int> pVar10;
  char cVar11;
  int byte_limit;
  UnknownFieldSet *pUVar12;
  uint uVar13;
  ulong uVar14;
  pair<unsigned_long,_bool> pVar15;
  
  this_00 = &this->_internal_metadata_;
  do {
    pbVar4 = input->buffer_;
    uVar9 = 0;
    if (pbVar4 < input->buffer_end_) {
      bVar2 = *pbVar4;
      uVar9 = (uint32)bVar2;
      pbVar1 = pbVar4 + 1;
      uVar13 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        if ((input->buffer_end_ <= pbVar1) || ((~(uint)*pbVar1 & uVar13) < 0x80)) goto LAB_001febe9;
        uVar13 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
        input->buffer_ = pbVar4 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar14 = (ulong)uVar13 | 0x100000000;
    }
    else {
LAB_001febe9:
      uVar9 = io::CodedInputStream::ReadTagFallback(input,uVar9);
      uVar14 = 0;
      if (uVar9 - 1 < 0x3fff) {
        uVar14 = 0x100000000;
      }
      uVar14 = uVar9 | uVar14;
    }
    uVar13 = (uint)uVar14;
    if ((uVar14 & 0x100000000) == 0) {
LAB_001feaef:
      cVar11 = '\a';
      if ((uVar13 & 7) != 4 && uVar13 != 0) {
        if (uVar13 < 8000) {
          pvVar6 = (this_00->
                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   ).ptr_;
          if (((ulong)pvVar6 & 1) == 0) {
            pUVar12 = internal::
                      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ::mutable_unknown_fields_slow
                                (&this_00->
                                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                );
          }
          else {
            pUVar12 = (UnknownFieldSet *)((ulong)pvVar6 & 0xfffffffffffffffe);
          }
          bVar7 = internal::WireFormat::SkipField(input,uVar13,pUVar12);
LAB_001feb63:
          cVar11 = '\x06';
          if (bVar7 != false) goto LAB_001feb6a;
        }
        else {
          pvVar6 = (this_00->
                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   ).ptr_;
          if (((ulong)pvVar6 & 1) == 0) {
            pUVar12 = internal::
                      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ::mutable_unknown_fields_slow
                                (&this_00->
                                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                );
          }
          else {
            pUVar12 = (UnknownFieldSet *)((ulong)pvVar6 & 0xfffffffffffffffe);
          }
          bVar7 = internal::ExtensionSet::ParseField
                            (&this->_extensions_,uVar13,input,
                             (Message *)&_ServiceOptions_default_instance_,pUVar12);
          cVar11 = !bVar7 * '\x03' + '\x03';
        }
      }
    }
    else {
      uVar8 = (uint)(uVar14 >> 3) & 0x1fffffff;
      if (uVar8 == 999) {
        if ((char)uVar14 != ':') goto LAB_001feaef;
        this_01 = internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                            (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,(Type *)0x0);
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (byte_limit = (int)(char)*puVar5, -1 < (char)*puVar5))
        {
          input->buffer_ = puVar5 + 1;
          bVar7 = true;
        }
        else {
          byte_limit = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          bVar7 = -1 < byte_limit;
        }
        cVar11 = '\x06';
        if (bVar7) {
          pVar10 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,byte_limit);
          cVar11 = '\x06';
          if (-1 < (long)pVar10) {
            bVar7 = UninterpretedOption::MergePartialFromCodedStream(this_01,input);
            cVar11 = '\x06';
            if (bVar7) {
              bVar7 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar10.first);
              goto LAB_001feb63;
            }
          }
        }
      }
      else {
        if ((uVar8 != 0x21) || ((char)uVar14 != '\b')) goto LAB_001feaef;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (uVar3 = *puVar5, -1 < (long)(char)uVar3)) {
          input->buffer_ = puVar5 + 1;
          pVar15._8_8_ = 1;
          pVar15.first = (long)(char)uVar3;
        }
        else {
          pVar15 = io::CodedInputStream::ReadVarint64Fallback(input);
        }
        cVar11 = '\x06';
        if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_001feb6c;
        this->deprecated_ = pVar15.first != 0;
LAB_001feb6a:
        cVar11 = '\0';
      }
    }
LAB_001feb6c:
    if ((cVar11 != '\0') && (cVar11 != '\x03')) {
      return cVar11 != '\x06';
    }
  } while( true );
}

Assistant:

bool ServiceOptions::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:google.protobuf.ServiceOptions)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional bool deprecated = 33 [default = false];
      case 33: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(264u)) {
          set_has_deprecated();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &deprecated_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(7994u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_uninterpreted_option()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        if ((8000u <= tag)) {
          DO_(_extensions_.ParseField(tag, input, internal_default_instance(),
                                      mutable_unknown_fields()));
          continue;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:google.protobuf.ServiceOptions)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:google.protobuf.ServiceOptions)
  return false;
#undef DO_
}